

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmExpressionFunctions.cpp
# Opt level: O0

void registerArmExpressionFunctions(ExpressionFunctionHandler *handler)

{
  char *__s;
  ExpressionFunctionEntry (*this) [2];
  allocator<char> local_71;
  string local_70;
  Identifier local_50;
  ExpressionFunctionEntry *local_30;
  ExpressionFunctionEntry *func;
  ExpressionFunctionEntry *__end1;
  ExpressionFunctionEntry *__begin1;
  ExpressionFunctionEntry (*__range1) [2];
  ExpressionFunctionHandler *handler_local;
  
  __begin1 = armExpressionFunctions;
  func = (ExpressionFunctionEntry *)&ArmElfRelocator::vtable;
  __range1 = (ExpressionFunctionEntry (*) [2])handler;
  for (__end1 = armExpressionFunctions; this = __range1, __end1 != func; __end1 = __end1 + 1) {
    local_30 = __end1;
    __s = __end1->name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_71);
    Identifier::Identifier(&local_50,&local_70);
    ExpressionFunctionHandler::addFunction
              ((ExpressionFunctionHandler *)this,&local_50,local_30->function,local_30->minParams,
               local_30->maxParams,local_30->safety);
    Identifier::~Identifier(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  return;
}

Assistant:

void registerArmExpressionFunctions(ExpressionFunctionHandler &handler)
{
	for (const auto &func : armExpressionFunctions)
	{
		handler.addFunction(Identifier(func.name), func.function, func.minParams, func.maxParams, func.safety);
	}
}